

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

int google::protobuf::CEscapeInternal
              (char *src,int src_len,char *dest,int dest_len,bool use_hex,bool utf8_safe)

{
  byte bVar1;
  uint uVar2;
  int in_ECX;
  int iVar3;
  long in_RDX;
  int in_ESI;
  char *__format;
  byte *in_RDI;
  byte in_R8B;
  byte in_R9B;
  bool is_hex_escape;
  bool last_hex_escape;
  int used;
  char *src_end;
  byte local_36;
  byte local_35;
  int local_34;
  byte *local_10;
  int local_4;
  
  local_34 = 0;
  local_35 = 0;
  local_10 = in_RDI;
  while( true ) {
    if (in_RDI + in_ESI <= local_10) {
      if (in_ECX - local_34 < 1) {
        local_4 = -1;
      }
      else {
        *(undefined1 *)(in_RDX + local_34) = 0;
        local_4 = local_34;
      }
      return local_4;
    }
    if (in_ECX - local_34 < 2) break;
    local_36 = 0;
    bVar1 = *local_10;
    if (bVar1 == 9) {
      iVar3 = local_34 + 1;
      *(undefined1 *)(in_RDX + local_34) = 0x5c;
      local_34 = local_34 + 2;
      *(undefined1 *)(in_RDX + iVar3) = 0x74;
    }
    else if (bVar1 == 10) {
      iVar3 = local_34 + 1;
      *(undefined1 *)(in_RDX + local_34) = 0x5c;
      local_34 = local_34 + 2;
      *(undefined1 *)(in_RDX + iVar3) = 0x6e;
    }
    else if (bVar1 == 0xd) {
      iVar3 = local_34 + 1;
      *(undefined1 *)(in_RDX + local_34) = 0x5c;
      local_34 = local_34 + 2;
      *(undefined1 *)(in_RDX + iVar3) = 0x72;
    }
    else if (bVar1 == 0x22) {
      iVar3 = local_34 + 1;
      *(undefined1 *)(in_RDX + local_34) = 0x5c;
      local_34 = local_34 + 2;
      *(undefined1 *)(in_RDX + iVar3) = 0x22;
    }
    else if (bVar1 == 0x27) {
      iVar3 = local_34 + 1;
      *(undefined1 *)(in_RDX + local_34) = 0x5c;
      local_34 = local_34 + 2;
      *(undefined1 *)(in_RDX + iVar3) = 0x27;
    }
    else if (bVar1 == 0x5c) {
      iVar3 = local_34 + 1;
      *(undefined1 *)(in_RDX + local_34) = 0x5c;
      local_34 = local_34 + 2;
      *(undefined1 *)(in_RDX + iVar3) = 0x5c;
    }
    else if ((((in_R9B & 1) == 0) || (*local_10 < 0x80)) &&
            ((uVar2 = isprint((int)(char)*local_10), (uVar2 & 1) == 0 ||
             ((local_35 != 0 && (uVar2 = isxdigit((int)(char)*local_10), (uVar2 & 1) != 0)))))) {
      if (in_ECX - local_34 < 4) {
        return -1;
      }
      __format = "\\%03o";
      if ((in_R8B & 1) != 0) {
        __format = "\\x%02x";
      }
      sprintf((char *)(in_RDX + local_34),__format,(ulong)*local_10);
      local_36 = in_R8B & 1;
      local_34 = local_34 + 4;
    }
    else {
      *(byte *)(in_RDX + local_34) = *local_10;
      local_34 = local_34 + 1;
    }
    local_35 = local_36;
    local_10 = local_10 + 1;
  }
  return -1;
}

Assistant:

int CEscapeInternal(const char* src, int src_len, char* dest,
                    int dest_len, bool use_hex, bool utf8_safe) {
  const char* src_end = src + src_len;
  int used = 0;
  bool last_hex_escape = false; // true if last output char was \xNN

  for (; src < src_end; src++) {
    if (dest_len - used < 2)   // Need space for two letter escape
      return -1;

    bool is_hex_escape = false;
    switch (*src) {
      case '\n': dest[used++] = '\\'; dest[used++] = 'n';  break;
      case '\r': dest[used++] = '\\'; dest[used++] = 'r';  break;
      case '\t': dest[used++] = '\\'; dest[used++] = 't';  break;
      case '\"': dest[used++] = '\\'; dest[used++] = '\"'; break;
      case '\'': dest[used++] = '\\'; dest[used++] = '\''; break;
      case '\\': dest[used++] = '\\'; dest[used++] = '\\'; break;
      default:
        // Note that if we emit \xNN and the src character after that is a hex
        // digit then that digit must be escaped too to prevent it being
        // interpreted as part of the character code by C.
        if ((!utf8_safe || static_cast<uint8>(*src) < 0x80) &&
            (!isprint(*src) ||
             (last_hex_escape && isxdigit(*src)))) {
          if (dest_len - used < 4) // need space for 4 letter escape
            return -1;
          sprintf(dest + used, (use_hex ? "\\x%02x" : "\\%03o"),
                  static_cast<uint8>(*src));
          is_hex_escape = use_hex;
          used += 4;
        } else {
          dest[used++] = *src; break;
        }
    }
    last_hex_escape = is_hex_escape;
  }

  if (dest_len - used < 1)   // make sure that there is room for \0
    return -1;

  dest[used] = '\0';   // doesn't count towards return value though
  return used;
}